

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::TestShortcutRouting(ImGuiKeyChord key_chord,ImGuiID owner_id)

{
  ImGuiID IVar1;
  ImGuiKeyRoutingData *pIVar2;
  ImGuiID in_ESI;
  ImGuiKeyRoutingData *routing_data;
  ImGuiID routing_id;
  ImGuiKeyChord in_stack_0000002c;
  
  IVar1 = GetRoutingIdFromOwnerId(in_ESI);
  FixupKeyChord(0);
  pIVar2 = GetShortcutRoutingData(in_stack_0000002c);
  return pIVar2->RoutingCurr == IVar1;
}

Assistant:

bool ImGui::TestShortcutRouting(ImGuiKeyChord key_chord, ImGuiID owner_id)
{
    const ImGuiID routing_id = GetRoutingIdFromOwnerId(owner_id);
    key_chord = FixupKeyChord(key_chord);
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord); // FIXME: Could avoid creating entry.
    return routing_data->RoutingCurr == routing_id;
}